

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

void trm_lysc_tree_ctx(lys_module *module,ly_out *out,size_t max_line_length,trt_printer_ctx *pc,
                      trt_tree_ctx *tc)

{
  undefined1 local_98 [4];
  undefined4 local_94;
  lysp_module *local_90;
  lysc_module *local_88;
  undefined8 local_80;
  undefined8 local_78;
  lysc_node *local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined1 local_37;
  trt_tree_ctx *local_30;
  trt_tree_ctx *tc_local;
  trt_printer_ctx *pc_local;
  size_t max_line_length_local;
  ly_out *out_local;
  lys_module *module_local;
  
  local_98[0] = 1;
  local_94 = 0;
  local_90 = module->parsed;
  local_88 = module->compiled;
  local_80 = 0;
  local_78 = 0;
  local_70 = module->compiled->data;
  local_68 = 0;
  local_60 = 0;
  local_58 = 0;
  local_50 = 0;
  local_48 = 0;
  local_40 = 0;
  local_38 = 1;
  local_37 = 0;
  local_30 = tc;
  tc_local = (trt_tree_ctx *)pc;
  pc_local = (trt_printer_ctx *)max_line_length;
  max_line_length_local = (size_t)out;
  out_local = (ly_out *)module;
  memcpy(tc,local_98,0x68);
  tc_local->lysc_tree = (undefined1)max_line_length_local;
  *(undefined3 *)&tc_local->field_0x1 = max_line_length_local._1_3_;
  tc_local->section = max_line_length_local._4_4_;
  tc_local->pmod = (lysp_module *)troc_modi_parent;
  tc_local->cmod = (lysc_module *)troc_modi_first_sibling;
  tc_local->pn = (lysp_node *)troc_modi_next_sibling;
  tc_local->tpn = (lysp_node *)troc_modi_next_child;
  tc_local->cn = (lysc_node *)tro_read_module_name;
  *(code **)&tc_local->last_error = troc_read_node;
  (tc_local->plugin_ctx).ctx = (lyspr_tree_ctx *)troc_read_if_sibling_exists;
  (tc_local->plugin_ctx).schema = (lyspr_tree_schema *)tro_read_if_sibling_exists;
  *(code **)&(tc_local->plugin_ctx).filtered = tro_print_features_names;
  (tc_local->plugin_ctx).node_overr.flags = (char *)tro_print_keys;
  (tc_local->plugin_ctx).node_overr.add_opts = (char *)pc_local;
  return;
}

Assistant:

static void
trm_lysc_tree_ctx(const struct lys_module *module, struct ly_out *out, size_t max_line_length,
        struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    *tc = (struct trt_tree_ctx) {
        .lysc_tree = 1,
        .section = TRD_SECT_MODULE,
        .pmod = module->parsed,
        .cmod = module->compiled,
        .tpn = NULL,
        .pn = NULL,
        .cn = module->compiled->data,
        .last_error = 0,
        .plugin_ctx = {
            .ctx = NULL,
            .schema = NULL,
            .filtered = 0,
            .node_overr = TRP_TREE_CTX_EMPTY_NODE_OVERR,
            .last_schema = 1,
            .last_error = 0
        }

    };

    pc->out = out;

    pc->fp.modify = TRP_TRT_FP_MODIFY_COMPILED;
    pc->fp.read = TRP_TRT_FP_READ_COMPILED;

    pc->fp.print = (struct trt_fp_print) {
        .print_features_names = tro_print_features_names,
        .print_keys = tro_print_keys
    };

    pc->max_line_length = max_line_length;
}